

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::PrimitiveOneofFieldGenerator::GenerateMembers
          (PrimitiveOneofFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar1;
  FieldDescriptor *pFVar2;
  _func_void_FieldDescriptor_ptr *local_38;
  FieldDescriptor *local_30;
  
  WritePropertyDocComment
            (printer,(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.descriptor_);
  FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
  pmVar1 = &(this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.variables_;
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
  pFVar2 = (this->super_PrimitiveFieldGenerator).super_FieldGeneratorBase.descriptor_;
  if (*(int *)(pFVar2 + 0x3c) != 3) {
    if (*(once_flag **)(pFVar2 + 0x30) != (once_flag *)0x0) {
      local_38 = google::protobuf::FieldDescriptor::TypeOnceInit;
      local_30 = pFVar2;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar2 + 0x30),&local_38,&local_30);
    }
    if ((*(int *)(pFVar2 + 0x38) != 0xb) &&
       ((*(int *)(*(long *)(pFVar2 + 0x28) + 0x3c) == 2 || (pFVar2[0x41] == (FieldDescriptor)0x1))))
    {
      google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
      FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
      google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
      google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
      FieldGeneratorBase::AddPublicMemberAttributes((FieldGeneratorBase *)this,printer);
      google::protobuf::io::Printer::Print((map *)printer,(char *)pmVar1);
    }
  }
  return;
}

Assistant:

void PrimitiveOneofFieldGenerator::GenerateMembers(io::Printer* printer) {
  WritePropertyDocComment(printer, descriptor_);
  AddPublicMemberAttributes(printer);
  printer->Print(
    variables_,
    "$access_level$ $type_name$ $property_name$ {\n"
    "  get { return $has_property_check$ ? ($type_name$) $oneof_name$_ : $default_value$; }\n"
    "  set {\n");
  if (is_value_type) {
    printer->Print(
      variables_,
      "    $oneof_name$_ = value;\n");
  } else {
    printer->Print(
      variables_,
      "    $oneof_name$_ = pb::ProtoPreconditions.CheckNotNull(value, \"value\");\n");
  }
  printer->Print(
    variables_,
    "    $oneof_name$Case_ = $oneof_property_name$OneofCase.$property_name$;\n"
    "  }\n"
    "}\n");
  if (SupportsPresenceApi(descriptor_)) {
    printer->Print(
      variables_,
      "/// <summary>Gets whether the \"$descriptor_name$\" field is set</summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ bool Has$property_name$ {\n"
      "  get { return $oneof_name$Case_ == $oneof_property_name$OneofCase.$property_name$; }\n"
      "}\n");
    printer->Print(
      variables_,
      "/// <summary> Clears the value of the oneof if it's currently set to \"$descriptor_name$\" </summary>\n");
    AddPublicMemberAttributes(printer);
    printer->Print(
      variables_,
      "$access_level$ void Clear$property_name$() {\n"
      "  if ($has_property_check$) {\n"
      "    Clear$oneof_property_name$();\n"
      "  }\n"
      "}\n");
  }
}